

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

HashElem * findElementGivenHash(Hash *pH,char *pKey,int nKey,uint h)

{
  HashElem *pHVar1;
  int iVar2;
  Hash *pHVar3;
  Hash *pHVar4;
  uint uVar5;
  
  pHVar3 = (Hash *)(pH->ht + h);
  pHVar4 = (Hash *)&pH->count;
  if (pH->ht != (_ht *)0x0) {
    pHVar4 = pHVar3;
    pH = pHVar3;
  }
  uVar5 = pHVar4->htsize;
  if (uVar5 != 0) {
    for (pHVar1 = pH->first; pHVar1 != (HashElem *)0x0; pHVar1 = pHVar1->next) {
      uVar5 = uVar5 - 1;
      if ((pHVar1->nKey == nKey) && (iVar2 = sqlite3_strnicmp(pHVar1->pKey,pKey,nKey), iVar2 == 0))
      {
        return pHVar1;
      }
      if (uVar5 == 0) {
        return (HashElem *)0x0;
      }
    }
  }
  return (HashElem *)0x0;
}

Assistant:

static HashElem *findElementGivenHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  int nKey,           /* Bytes in key (not counting zero terminator) */
  unsigned int h      /* The hash for this key. */
){
  HashElem *elem;                /* Used to loop thru the element list */
  int count;                     /* Number of elements left to test */

  if( pH->ht ){
    struct _ht *pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    elem = pH->first;
    count = pH->count;
  }
  while( count-- && ALWAYS(elem) ){
    if( elem->nKey==nKey && sqlite3StrNICmp(elem->pKey,pKey,nKey)==0 ){ 
      return elem;
    }
    elem = elem->next;
  }
  return 0;
}